

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ConstantFilter::Deserialize(ConstantFilter *this,Deserializer *deserializer)

{
  ExpressionType comparison_type_p;
  ConstantFilter *this_00;
  Value VStack_98;
  Value constant;
  
  comparison_type_p =
       Deserializer::ReadProperty<duckdb::ExpressionType>(deserializer,200,"comparison_type");
  Deserializer::ReadProperty<duckdb::Value>(&constant,deserializer,0xc9,"constant");
  this_00 = (ConstantFilter *)operator_new(0x50);
  Value::Value(&VStack_98,&constant);
  ConstantFilter(this_00,comparison_type_p,&VStack_98);
  Value::~Value(&VStack_98);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  Value::~Value(&constant);
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ConstantFilter::Deserialize(Deserializer &deserializer) {
	auto comparison_type = deserializer.ReadProperty<ExpressionType>(200, "comparison_type");
	auto constant = deserializer.ReadProperty<Value>(201, "constant");
	auto result = duckdb::unique_ptr<ConstantFilter>(new ConstantFilter(comparison_type, constant));
	return std::move(result);
}